

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O0

void __thiscall
mp::SPAdapter::GetVarStages<mp::BasicSuffix<int>>(SPAdapter *this,BasicSuffix<int> stage_suffix)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  int *piVar4;
  size_type sVar5;
  vector<int,_std::allocator<int>_> *in_RDI;
  int stage;
  int n;
  int i;
  int in_stack_ffffffffffffffcc;
  int local_24;
  int local_20;
  int local_1c;
  int iVar6;
  vector<int,_std::allocator<int>_> *this_00;
  
  iVar6 = 0;
  this_00 = in_RDI;
  iVar2 = BasicProblem<mp::BasicProblemParams<int>_>::num_vars
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)0x1ce748);
  for (; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI + 0xd,(long)iVar6);
    if (*pvVar3 == 0) {
      local_20 = BasicSuffix<int>::value((BasicSuffix<int> *)in_RDI,in_stack_ffffffffffffffcc);
      local_20 = local_20 + -1;
      local_24 = 0;
      piVar4 = std::max<int>(&local_20,&local_24);
      iVar1 = *piVar4;
      local_1c = iVar1;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI + 0xd,(long)iVar6);
      *pvVar3 = iVar1;
      in_stack_ffffffffffffffcc = local_1c;
      sVar5 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)
                         &in_RDI[0xe].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish);
      if ((int)sVar5 <= in_stack_ffffffffffffffcc) {
        std::vector<int,_std::allocator<int>_>::resize(this_00,CONCAT44(iVar6,iVar2));
      }
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[0xe].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)local_1c);
      *pvVar3 = *pvVar3 + 1;
    }
  }
  return;
}

Assistant:

void SPAdapter::GetVarStages(Suffix stage_suffix) {
  // Count the number of variables in each stage and temporarily store variable
  // stages in var_orig2core_.
  for (int i = 0, n = problem_.num_vars(); i < n; ++i) {
    if (var_orig2core_[i])
      continue;  // Skip random variables.
    int stage = std::max(stage_suffix.value(i) - 1, 0);
    var_orig2core_[i] = stage;
    if (stage >= static_cast<int>(num_stage_vars_.size()))
      num_stage_vars_.resize(stage + 1);
    ++num_stage_vars_[stage];
  }
}